

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineStateBase.hpp
# Opt level: O3

void __thiscall
Diligent::PipelineStateBase<Diligent::EngineGLImplTraits>::Destruct
          (PipelineStateBase<Diligent::EngineGLImplTraits> *this)

{
  PIPELINE_TYPE PVar1;
  GraphicsPipelineData *pGVar2;
  IRenderPass *pIVar3;
  IMemoryAllocator *pIVar4;
  long lVar5;
  ulong uVar6;
  string msg;
  string local_38;
  
  if (this->m_IsDestructed == true) {
    FormatString<char[40]>(&local_38,(char (*) [40])"This object has already been destructed");
    DebugAssertionFailed
              (local_38._M_dataplus._M_p,"Destruct",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/PipelineStateBase.hpp"
               ,0x1c7);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
  }
  PVar1 = (this->
          super_DeviceObjectBase<Diligent::IPipelineStateGL,_Diligent::RenderDeviceGLImpl,_Diligent::PipelineStateDesc>
          ).m_Desc.PipelineType;
  if ((PVar1 & ~PIPELINE_TYPE_MESH) == PIPELINE_TYPE_GRAPHICS) {
    pGVar2 = (this->field_6).m_pGraphicsPipelineData;
    if ((pGVar2 != (GraphicsPipelineData *)0x0) &&
       (pIVar3 = (pGVar2->pRenderPass).m_pObject, pIVar3 != (IRenderPass *)0x0)) {
      (*(pIVar3->super_IDeviceObject).super_IObject._vptr_IObject[2])();
      (pGVar2->pRenderPass).m_pObject = (IRenderPass *)0x0;
    }
  }
  else if ((PVar1 == PIPELINE_TYPE_RAY_TRACING) &&
          ((this->field_6).m_pGraphicsPipelineData != (GraphicsPipelineData *)0x0)) {
    std::
    _Hashtable<Diligent::HashMapStringKey,_std::pair<const_Diligent::HashMapStringKey,_unsigned_int>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::HashMapStringKey>,_std::hash<Diligent::HashMapStringKey>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable((_Hashtable<Diligent::HashMapStringKey,_std::pair<const_Diligent::HashMapStringKey,_unsigned_int>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::HashMapStringKey>,_std::hash<Diligent::HashMapStringKey>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   *)&(((this->field_6).m_pGraphicsPipelineData)->Desc).BlendDesc.RenderTargets[0].
                      DestBlendAlpha);
  }
  if (this->m_Signatures != (SignatureAutoPtrType *)0x0) {
    if (this->m_SignatureCount != '\0') {
      lVar5 = 0;
      uVar6 = 0;
      do {
        RefCntAutoPtr<Diligent::PipelineResourceSignatureGLImpl>::Release
                  ((RefCntAutoPtr<Diligent::PipelineResourceSignatureGLImpl> *)
                   ((long)&this->m_Signatures->m_pObject + lVar5));
        uVar6 = uVar6 + 1;
        lVar5 = lVar5 + 8;
      } while (uVar6 < this->m_SignatureCount);
    }
    this->m_Signatures = (SignatureAutoPtrType *)0x0;
  }
  if ((this->field_6).m_pGraphicsPipelineData != (GraphicsPipelineData *)0x0) {
    pIVar4 = GetRawAllocator();
    (*pIVar4->_vptr_IMemoryAllocator[1])(pIVar4,(this->field_6).m_pGraphicsPipelineData);
    (this->field_6).m_pGraphicsPipelineData = (GraphicsPipelineData *)0x0;
  }
  this->m_IsDestructed = true;
  return;
}

Assistant:

void Destruct()
    {
        VERIFY(!m_IsDestructed, "This object has already been destructed");

        if (this->m_Desc.IsAnyGraphicsPipeline() && m_pGraphicsPipelineData != nullptr)
        {
            m_pGraphicsPipelineData->~GraphicsPipelineData();
        }
        else if (this->m_Desc.IsRayTracingPipeline() && m_pRayTracingPipelineData != nullptr)
        {
            m_pRayTracingPipelineData->~RayTracingPipelineData();
        }
        else if (this->m_Desc.IsTilePipeline() && m_pTilePipelineData != nullptr)
        {
            m_pTilePipelineData->~TilePipelineData();
        }

        if (m_Signatures != nullptr)
        {
            for (Uint32 i = 0; i < m_SignatureCount; ++i)
                m_Signatures[i].~SignatureAutoPtrType();
            m_Signatures = nullptr;
        }

        if (m_pPipelineDataRawMem)
        {
            GetRawAllocator().Free(m_pPipelineDataRawMem);
            m_pPipelineDataRawMem = nullptr;
        }
#if DILIGENT_DEBUG
        m_IsDestructed = true;
#endif
    }